

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputerPlayer.cpp
# Opt level: O0

Card * __thiscall ComputerPlayer::theGreatestAvailable(ComputerPlayer *this)

{
  Card *this_00;
  Card *rhs;
  bool bVar1;
  reference ppCVar2;
  Deal *this_01;
  Contract *c;
  __normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> local_30;
  Card *local_28;
  Card *tmp;
  Card *greatest;
  iterator it;
  ComputerPlayer *this_local;
  
  it._M_current = (Card **)this;
  greatest = (Card *)std::vector<Card_*,_std::allocator<Card_*>_>::begin(&this->available_cards);
  ppCVar2 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
            operator*((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)
                      &greatest);
  tmp = *ppCVar2;
  ppCVar2 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
            operator*((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)
                      &greatest);
  local_28 = *ppCVar2;
  __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::operator++
            ((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)&greatest)
  ;
  while( true ) {
    local_30._M_current =
         (Card **)std::vector<Card_*,_std::allocator<Card_*>_>::end(&this->available_cards);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)
                       &greatest,&local_30);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
              operator*((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *
                        )&greatest);
    rhs = tmp;
    this_00 = *ppCVar2;
    local_28 = this_00;
    this_01 = Game::getCurrentDeal((this->super_Player)._game);
    c = Deal::getContract(this_01);
    bVar1 = Card::isBigger(this_00,rhs,c);
    if (bVar1) {
      tmp = local_28;
    }
    __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::operator++
              ((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)
               &greatest);
  }
  return tmp;
}

Assistant:

Card *ComputerPlayer::theGreatestAvailable() {
    vector<Card *>::iterator it = available_cards.begin();
    Card *greatest = *it;

    //greatest Card in available cards
    Card *tmp = *it;
    for (++it; it != available_cards.end(); ++it) {
        tmp = *it;
        if (tmp->isBigger(greatest, _game->getCurrentDeal()->getContract()))
            greatest = tmp;
        //std::cout << ' ' << greatest->getValue() << '\n';
    }

    return greatest;
}